

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiBone **_dest,aiBone *src)

{
  aiVertexWeight *__src;
  aiBone *__dest;
  aiVertexWeight *__dest_00;
  ulong __n;
  
  if (src != (aiBone *)0x0 && _dest != (aiBone **)0x0) {
    __dest = (aiBone *)operator_new(0x460);
    *_dest = __dest;
    memcpy(__dest,src,0x460);
    __src = __dest->mWeights;
    if (__src != (aiVertexWeight *)0x0) {
      __n = (ulong)__dest->mNumWeights << 3;
      __dest_00 = (aiVertexWeight *)operator_new__(__n);
      __dest->mWeights = __dest_00;
      memcpy(__dest_00,__src,__n);
      return;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiBone** _dest, const aiBone* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiBone* dest = *_dest = new aiBone();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiBone));

    // and reallocate all arrays
    GetArrayCopy( dest->mWeights, dest->mNumWeights );
}